

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpServer.h
# Opt level: O3

int __thiscall TcpServer::addToWrite(TcpServer *this,int fd)

{
  _Rb_tree_header *p_Var1;
  int iVar2;
  _Base_ptr p_Var3;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  int iVar6;
  int local_24 [2];
  int fd_local;
  
  p_Var3 = (this->connections)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  iVar2 = 0;
  iVar6 = 0;
  if (p_Var3 != (_Base_ptr)0x0) {
    p_Var1 = &(this->connections)._M_t._M_impl.super__Rb_tree_header;
    p_Var5 = &p_Var1->_M_header;
    do {
      if (fd <= (int)p_Var3[1]._M_color) {
        p_Var5 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < fd];
    } while (p_Var3 != (_Base_ptr)0x0);
    iVar6 = iVar2;
    if (((_Rb_tree_header *)p_Var5 != p_Var1) && ((int)p_Var5[1]._M_color <= fd)) {
      local_24[0] = fd;
      pmVar4 = std::
               map<int,_TcpConnection,_std::less<int>,_std::allocator<std::pair<const_int,_TcpConnection>_>_>
               ::operator[](&this->connections,local_24);
      *(byte *)&(pmVar4->event).events = (byte)(pmVar4->event).events | 4;
      (pmVar4->event).data.fd = local_24[0];
      iVar2 = epoll_ctl(this->epollFd,3,local_24[0],(epoll_event *)&pmVar4->event);
      if (iVar2 == -1) {
        recordError(this,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                    ,0x19c);
        Logger::printLog(&logger,LOG_ERROR,&this->errorString,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/zhangke96[P]TcpServer/TcpServer/TcpServer.h"
                         ,0x19d);
        iVar6 = -1;
      }
    }
  }
  return iVar6;
}

Assistant:

int addToWrite(int fd) {
    if (!isVaildConnection(fd)) {
      return 0;
    }
    auto &event = connections[fd].event;
    // printEvent(-1, event.events);
    event.events |= EPOLLOUT;
    event.data.fd = fd;
    if (epoll_ctl(epollFd, EPOLL_CTL_MOD, fd, &event) == -1) {
      recordError(__FILE__, __LINE__);
      Log(logger, Logger::LOG_ERROR, errorString);
      return -1;
    }
    return 0;
  }